

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O2

bool operator==(Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::NoTempering>
                *lhs,Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::NoTempering>
                     *rhs)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t *psVar7;
  size_t *psVar8;
  long lVar9;
  
  uVar6 = rhs->index_ + 0x56f;
  psVar8 = (size_t *)(&lhs->field_0x15bc + lhs->index_ * 4);
  uVar5 = lhs->index_ + 0x56f;
  psVar7 = (size_t *)(&rhs->field_0x15bc + rhs->index_ * 4);
  lVar3 = 0x56f;
  do {
    lVar9 = lVar3;
    uVar4 = uVar6 / 0x56f;
    if (lVar9 == 0) break;
    piVar1 = (int *)((long)psVar8 + (uVar5 / 0x56f) * -0x15bc);
    uVar6 = uVar6 + 1;
    psVar8 = (size_t *)((long)psVar8 + 4);
    uVar5 = uVar5 + 1;
    piVar2 = (int *)((long)psVar7 + uVar4 * -0x15bc);
    psVar7 = (size_t *)((long)psVar7 + 4);
    lVar3 = lVar9 + -1;
  } while (*piVar1 == *piVar2);
  return lVar9 == 0;
}

Assistant:

bool operator==(const Well& lhs, const Well& rhs)
    {
        for (std::size_t i = 0; i != state_size; ++i)
            if (lhs.compute(i) != rhs.compute(i))
                return false;

        return true;
    }